

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O1

string * __thiscall
FIX::DoubleConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,DoubleConvertor *this,double value,int padding,
          int significant_digits)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char result [32];
  undefined8 uStack_50;
  char local_48 [32];
  
  pcVar5 = local_48;
  iVar7 = (int)this;
  if ((value < -0.0001) || (((value == 0.0 && (!NAN(value))) || (0.0001 < value)))) {
    uStack_50 = 0x13e77d;
    iVar3 = FIX::DoubleConvertor::fast_dtoa(local_48,0x20,value,padding);
    if (iVar3 == 0) goto LAB_0013e7aa;
    if (0 < iVar7) {
      pcVar6 = local_48 + (long)iVar3 + -1;
      iVar7 = iVar7 + (int)local_48;
      for (; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
        if (*pcVar5 == '.') goto LAB_0013e7e6;
        iVar7 = iVar7 + 1;
      }
      *pcVar5 = '.';
      iVar3 = iVar3 + 1;
      pcVar6 = pcVar5;
LAB_0013e7e6:
      uVar4 = iVar7 - (int)pcVar6;
      if (0 < (int)uVar4) {
        uStack_50 = 0x13e801;
        memset(pcVar6 + 1,0x30,(ulong)uVar4);
        iVar3 = (iVar3 - (int)pcVar6) + iVar7;
      }
    }
  }
  else {
    uStack_50 = 0x13e712;
    iVar3 = FIX::DoubleConvertor::fast_fixed_dtoa(local_48,0x20,value,padding);
    if (iVar3 == 0) {
LAB_0013e7aa:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    if (iVar7 < 1) {
      if (local_48[(long)iVar3 + -1] == '0') {
        pcVar5 = local_48 + (long)iVar3 + -2;
        do {
          iVar3 = iVar3 + -1;
          cVar1 = *pcVar5;
          pcVar5 = pcVar5 + -1;
        } while (cVar1 == '0');
      }
    }
    else if (0 < padding - iVar7 && local_48[(long)iVar3 + -1] == '0') {
      pcVar5 = local_48 + (long)iVar3 + -2;
      iVar7 = padding - iVar7;
      do {
        iVar3 = iVar3 + -1;
        if (*pcVar5 != '0') break;
        pcVar5 = pcVar5 + -1;
        bVar2 = 1 < iVar7;
        iVar7 = iVar7 + -1;
      } while (bVar2);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  uStack_50 = 0x13e820;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_48,local_48 + iVar3);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(double value, int padding = 0, int significant_digits = SIGNIFICANT_DIGITS) {
    char result[BUFFFER_SIZE];
    char *end = 0;

    int size;
    if (value == 0 || value > 0.0001 || value < -0.0001) {
      size = fast_dtoa(result, BUFFFER_SIZE, value, significant_digits);
      if (size == 0) {
        return std::string();
      }

      if (padding > 0) {
        char *point = result;
        end = result + size - 1;
        while (*point != '.' && *point != 0) {
          point++;
        }

        if (*point == 0) {
          end = point;
          *point = '.';
          ++size;
        }
        int needed = padding - (int)(end - point);

        if (needed > 0) {
          memset(++end, '0', needed);
          size += needed;
        }
      }
    } else {
      size = fast_fixed_dtoa(result, BUFFFER_SIZE, value, significant_digits);
      if (size == 0) {
        return std::string();
      }

      // strip trailing 0's
      end = result + size - 1;

      if (padding > 0) {
        int discard = significant_digits - padding;

        while ((*end == '0') && (discard-- > 0)) {
          --end;
          --size;
        }
      } else {
        while (*end == '0') {
          --end;
          --size;
        }
      }
    }

    return std::string(result, size);
  }